

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

int cargo_fprintl_args(FILE *f,int argc,char **argv,int start,cargo_fprint_flags_t flags,
                      size_t max_width,size_t highlight_count,cargo_highlight_t *highlights)

{
  char *ptr;
  int iVar1;
  
  ptr = cargo_get_fprintl_args(argc,argv,start,flags,max_width,highlight_count,highlights);
  if (ptr == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    fprintf((FILE *)f,"%s\n",ptr);
    _cargo_free(ptr);
  }
  return iVar1;
}

Assistant:

int cargo_fprintl_args(FILE *f, int argc, char **argv, int start,
                       cargo_fprint_flags_t flags,
                       size_t max_width, size_t highlight_count,
                       const cargo_highlight_t *highlights)
{
    char *ret;
    if (!(ret = cargo_get_fprintl_args(argc, argv, start, flags,
                                max_width, highlight_count, highlights)))
    {
        return -1;
    }

    fprintf(f, "%s\n", ret);
    _cargo_free(ret);
    return 0;
}